

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void Fl::get_mouse(int *xx,int *yy)

{
  undefined1 local_3c [4];
  undefined1 local_38 [4];
  uint mask;
  int cy;
  int cx;
  int my;
  int mx;
  Window c;
  Window root;
  int *yy_local;
  int *xx_local;
  
  root = (Window)yy;
  yy_local = xx;
  fl_open_display();
  c = *(Window *)(*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x10);
  XQueryPointer(fl_display,c,&c,&my,&cx,&cy,&mask,local_38,local_3c);
  *yy_local = cx;
  *(int *)root = cy;
  return;
}

Assistant:

void Fl::get_mouse(int &xx, int &yy) {
  fl_open_display();
  Window root = RootWindow(fl_display, fl_screen);
  Window c; int mx,my,cx,cy; unsigned int mask;
  XQueryPointer(fl_display,root,&root,&c,&mx,&my,&cx,&cy,&mask);
  xx = mx;
  yy = my;
}